

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O0

int SPRKStepSetMethod(void *arkode_mem,ARKodeSPRKTable sprk_storage)

{
  ARKodeSPRKTable pAVar1;
  int retval;
  ARKodeSPRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  long *plVar2;
  undefined4 local_4;
  
  plVar2 = (long *)0x0;
  local_4 = sprkStep_AccessARKODEStepMem
                      ((void *)0x0,(char *)(ulong)in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8,(ARKodeSPRKStepMem *)0x197393);
  if (local_4 == 0) {
    if (*plVar2 != 0) {
      ARKodeSPRKTable_Free((ARKodeSPRKTable)0x1973c0);
      *plVar2 = 0;
    }
    pAVar1 = ARKodeSPRKTable_Copy((ARKodeSPRKTable)CONCAT44(local_4,in_stack_ffffffffffffffd0));
    *plVar2 = (long)pAVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SPRKStepSetMethod(void* arkode_mem, ARKodeSPRKTable sprk_storage)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeMem and ARKodeSPRKStepMem structures */
  retval = sprkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  if (step_mem->method)
  {
    ARKodeSPRKTable_Free(step_mem->method);
    step_mem->method = NULL;
  }

  step_mem->method = ARKodeSPRKTable_Copy(sprk_storage);

  return (ARK_SUCCESS);
}